

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<duckdb::hugeint_t,(char)44>
               (char *string_ptr,idx_t string_size,hugeint_t *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  duckdb *pdVar13;
  undefined1 uVar14;
  undefined7 in_register_00000081;
  undefined8 uVar15;
  undefined3 in_register_00000089;
  int params_2;
  ulong uVar16;
  char *pcVar17;
  string error;
  string local_d0;
  DecimalCastData<duckdb::hugeint_t> local_b0;
  uint local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  hugeint_t *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  params_2 = CONCAT31(in_register_00000089,scale);
  uVar15 = CONCAT71(in_register_00000081,width);
  local_78 = result;
  hugeint_t::hugeint_t(&local_b0.result,0);
  uVar6 = (ulong)(uint)((int)CONCAT71(in_register_00000081,width) << 4);
  local_b0.digit_count = '\0';
  local_b0.decimal_count = '\0';
  local_b0.round_set = false;
  local_b0.should_round = false;
  local_b0.excessive_decimals = '\0';
  local_b0.exponent_type = NONE;
  local_b0.limit.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + uVar6);
  local_b0.limit.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + uVar6 + 8);
  local_b0.width = width;
  local_b0.scale = scale;
  if (string_size != 0) {
    uVar16 = 0;
    do {
      bVar3 = string_ptr[uVar16];
      uVar6 = CONCAT71((int7)(uVar6 >> 8),bVar3);
      if ((4 < bVar3 - 9) && (bVar3 != 0x20)) {
        if (bVar3 == 0x2d) {
          if (string_size - 1 != uVar16) {
            uVar5 = string_size - uVar16;
            uVar10 = 1;
            uVar6 = uVar5;
            goto LAB_002ad94c;
          }
          DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(&local_b0)
          ;
          break;
        }
        if (bVar3 == 0x30 && string_size - 1 != uVar16) {
          bVar1 = string_ptr[uVar16 + 1];
          if (bVar1 < 0x62) {
            if ((bVar1 != 0x42) && (bVar1 != 0x58)) goto LAB_002ad9ed;
          }
          else if ((bVar1 != 0x62) && (bVar1 != 0x78)) goto LAB_002ad9ed;
          if ((string_size - uVar16) - 3 < 0xfffffffffffffffe) break;
        }
        else {
LAB_002ad9ed:
          uVar10 = string_size - uVar16;
          uVar11 = (ulong)(bVar3 == 0x2b);
          uVar5 = uVar11;
          if (uVar11 < uVar10) goto LAB_002ada09;
        }
        DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>(&local_b0);
        break;
      }
      uVar16 = uVar16 + 1;
    } while (string_size != uVar16);
    goto LAB_002ada86;
  }
  local_88 = 0;
  uStack_84 = 0;
  uStack_80._0_4_ = 0;
  uStack_80._4_4_ = 0;
  string_size = 0;
  goto LAB_002adaee;
  while( true ) {
    if (string_ptr[uVar16 + 1 + uVar10] == '_') {
      if ((string_size - uVar10) - 2 == uVar16) goto LAB_002ada86;
      uVar10 = uVar10 + 2;
      bVar3 = (string_ptr + uVar10)[uVar16] - 0x30;
      uVar6 = CONCAT71((int7)((ulong)(string_ptr + uVar10) >> 8),bVar3);
      if (9 < bVar3) goto LAB_002ada86;
    }
    else {
      uVar10 = uVar10 + 1;
    }
    uVar8 = uVar10;
    if (uVar5 <= uVar10) break;
LAB_002ad94c:
    uVar14 = (undefined1)uVar15;
    uVar4 = (uint)CONCAT71((int7)(uVar6 >> 8),string_ptr[uVar16 + uVar10]);
    uVar9 = uVar4 - 0x30;
    if (9 < (byte)uVar9) {
      uVar6 = uVar10;
      if (string_ptr[uVar16 + uVar10] != ',') goto LAB_002add2f;
      uVar11 = uVar10 + 1;
      uVar7 = uVar11;
      uVar6 = uVar11;
      goto joined_r0x002adbce;
    }
    bVar2 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                      (&local_b0,(byte)uVar9);
    if (!bVar2) goto LAB_002ada86;
    uVar6 = ~uVar10 + string_size;
    uVar8 = uVar5;
    if (uVar6 == uVar16) break;
  }
LAB_002add7a:
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(&local_b0)
  ;
  if ((bVar2) && (1 < uVar8)) goto LAB_002adeaa;
  goto LAB_002ada86;
  while( true ) {
    if ((string_size - uVar6) - 2 == uVar16) break;
    uVar6 = uVar6 + 2;
    bVar3 = (string_ptr + uVar6)[uVar16] - 0x30;
    uVar7 = CONCAT71((int7)((ulong)(string_ptr + uVar6) >> 8),bVar3);
    if (9 < bVar3) break;
joined_r0x002adbce:
    uVar8 = uVar6;
    if (uVar5 <= uVar6) {
LAB_002ade06:
      if ((1 < uVar10) || (uVar11 < uVar8)) goto LAB_002add7a;
      break;
    }
    uVar14 = (undefined1)uVar15;
    uVar4 = (uint)CONCAT71((int7)(uVar7 >> 8),string_ptr[uVar16 + uVar6]);
    bVar3 = (byte)(uVar4 - 0x30);
    if (9 < bVar3) {
      uVar9 = CONCAT31((int3)(uVar4 - 0x30 >> 8),1 < uVar10);
      if (uVar11 < uVar6 || 1 < uVar10) goto LAB_002add2f;
      break;
    }
    bVar2 = DecimalCastOperation::
            HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,true,true>(&local_b0,bVar3);
    if (!bVar2) break;
    uVar7 = ~uVar6 + string_size;
    uVar8 = uVar5;
    if (uVar7 == uVar16) goto LAB_002ade06;
    if (string_ptr[uVar16 + 1 + uVar6] != '_') {
      uVar6 = uVar6 + 1;
      goto joined_r0x002adbce;
    }
  }
  goto LAB_002ada86;
LAB_002add2f:
  uVar4 = uVar4 & 0xff;
  if (uVar4 < 0x20) {
    if (uVar4 - 9 < 5) {
LAB_002add43:
      uVar6 = uVar6 + 1;
      uVar8 = uVar6;
      if (uVar6 < uVar5) {
        do {
          if ((4 < (byte)string_ptr[uVar16 + uVar6] - 9) && (string_ptr[uVar16 + uVar6] != 0x20))
          goto LAB_002ada86;
          uVar6 = uVar6 + 1;
          uVar8 = uVar5;
        } while (uVar5 != uVar6);
      }
      goto LAB_002add7a;
    }
  }
  else if ((uVar4 == 0x65) || (uVar4 == 0x45)) {
    if ((uVar6 != 1) && (uVar6 + 1 < uVar5)) {
      local_d0._M_dataplus._M_p._0_2_ = 0;
      pdVar13 = (duckdb *)(string_ptr + uVar16 + uVar6 + 1);
      pcVar17 = (char *)(~uVar16 + (string_size - uVar6));
      if (*pdVar13 == (duckdb)0x2d) {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar13,pcVar17,(idx_t)&local_d0,(IntegerCastData<short> *)(ulong)uVar9,
                           (bool)uVar14);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar13,pcVar17,(idx_t)&local_d0,(IntegerCastData<short> *)(ulong)uVar9,
                           (bool)uVar14);
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::
                HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                          (&local_b0,(int)(short)local_d0._M_dataplus._M_p);
        goto LAB_002adf92;
      }
    }
  }
  else if (uVar4 == 0x20) goto LAB_002add43;
  goto LAB_002ada86;
  while( true ) {
    if (string_ptr[uVar16 + 1 + uVar5] == '_') {
      if ((string_size - uVar5) - 2 == uVar16) goto LAB_002ada86;
      uVar12 = uVar5 + 2;
      bVar3 = (string_ptr + uVar12)[uVar16] - 0x30;
      uVar6 = CONCAT71((int7)((ulong)(string_ptr + uVar12) >> 8),bVar3);
      if (9 < bVar3) goto LAB_002ada86;
    }
    else {
      uVar12 = uVar5 + 1;
    }
    uVar5 = uVar12;
    if (uVar10 <= uVar12) break;
LAB_002ada09:
    uVar14 = (undefined1)uVar15;
    uVar4 = (uint)CONCAT71((int7)(uVar6 >> 8),string_ptr[uVar16 + uVar5]);
    uVar9 = uVar4 - 0x30;
    if (9 < (byte)uVar9) {
      uVar6 = uVar5;
      if (string_ptr[uVar16 + uVar5] != ',') goto LAB_002ade42;
      uVar7 = uVar5 + 1;
      uVar8 = uVar7;
      uVar6 = uVar7;
      goto joined_r0x002adc7e;
    }
    bVar2 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                      (&local_b0,(byte)uVar9);
    if (!bVar2) goto LAB_002ada86;
    uVar6 = ~uVar5 + string_size;
    uVar12 = uVar10;
    if (uVar6 == uVar16) break;
  }
LAB_002ade8d:
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                    (&local_b0);
  if ((bVar2) && (uVar11 < uVar12)) {
LAB_002adeaa:
    local_78->lower = local_b0.result.lower;
    local_78->upper = local_b0.result.upper;
    return true;
  }
  goto LAB_002ada86;
LAB_002ade42:
  uVar4 = uVar4 & 0xff;
  if (uVar4 < 0x20) {
    if (uVar4 - 9 < 5) {
LAB_002ade56:
      uVar6 = uVar6 + 1;
      uVar12 = uVar6;
      if (uVar6 < uVar10) {
        do {
          if ((4 < (byte)string_ptr[uVar16 + uVar6] - 9) && (string_ptr[uVar16 + uVar6] != 0x20))
          goto LAB_002ada86;
          uVar6 = uVar6 + 1;
          uVar12 = uVar10;
        } while (uVar10 != uVar6);
      }
      goto LAB_002ade8d;
    }
  }
  else if ((uVar4 == 0x65) || (uVar4 == 0x45)) {
    if ((uVar6 != uVar11) && (uVar6 + 1 < uVar10)) {
      local_d0._M_dataplus._M_p._0_2_ = 0;
      pdVar13 = (duckdb *)(string_ptr + uVar16 + uVar6 + 1);
      pcVar17 = (char *)(~uVar16 + (string_size - uVar6));
      if (*pdVar13 == (duckdb)0x2d) {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar13,pcVar17,(idx_t)&local_d0,(IntegerCastData<short> *)(ulong)uVar9,
                           (bool)uVar14);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar13,pcVar17,(idx_t)&local_d0,(IntegerCastData<short> *)(ulong)uVar9,
                           (bool)uVar14);
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::
                HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                          (&local_b0,(int)(short)local_d0._M_dataplus._M_p);
LAB_002adf92:
        if (bVar2 != false) goto LAB_002adeaa;
      }
    }
  }
  else if (uVar4 == 0x20) goto LAB_002ade56;
  goto LAB_002ada86;
  while( true ) {
    if ((string_size - uVar6) - 2 == uVar16) break;
    uVar6 = uVar6 + 2;
    bVar3 = (string_ptr + uVar6)[uVar16] - 0x30;
    uVar8 = CONCAT71((int7)((ulong)(string_ptr + uVar6) >> 8),bVar3);
    if (9 < bVar3) break;
joined_r0x002adc7e:
    uVar12 = uVar6;
    if (uVar10 <= uVar6) {
LAB_002adf26:
      if ((uVar11 < uVar5) || (uVar7 < uVar12)) goto LAB_002ade8d;
      break;
    }
    uVar14 = (undefined1)uVar15;
    uVar4 = (uint)CONCAT71((int7)(uVar8 >> 8),string_ptr[uVar16 + uVar6]);
    bVar3 = (byte)(uVar4 - 0x30);
    if (9 < bVar3) {
      uVar9 = CONCAT31((int3)(uVar4 - 0x30 >> 8),uVar11 < uVar5);
      if (uVar7 < uVar6 || uVar11 < uVar5) goto LAB_002ade42;
      break;
    }
    bVar2 = DecimalCastOperation::
            HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,false,true>(&local_b0,bVar3);
    if (!bVar2) break;
    uVar8 = ~uVar6 + string_size;
    uVar12 = uVar10;
    if (uVar8 == uVar16) goto LAB_002adf26;
    if (string_ptr[uVar16 + 1 + uVar6] != '_') {
      uVar6 = uVar6 + 1;
      goto joined_r0x002adc7e;
    }
  }
LAB_002ada86:
  local_88 = (uint)string_size;
  if (local_88 < 0xd) {
    uStack_80._4_4_ = 0;
    uStack_84 = 0;
    uStack_80._0_4_ = 0;
    if (local_88 == 0) {
      string_size = 0;
    }
    else {
      switchD_00b041bd::default(&uStack_84,string_ptr,(ulong)(local_88 & 0xf));
    }
LAB_002adaee:
    string_ptr = (char *)&uStack_84;
    uStack_80 = (char *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
  }
  else {
    uStack_84 = *(undefined4 *)string_ptr;
    uStack_80 = string_ptr;
  }
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,string_ptr,string_ptr + (string_size & 0xffffffff));
  StringUtil::Format<std::__cxx11::string,int,int>
            (&local_d0,(StringUtil *)local_70,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)width,
             (uint)scale,params_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  HandleCastError::AssignError(&local_d0,parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT62(local_d0._M_dataplus._M_p._2_6_,(short)local_d0._M_dataplus._M_p) !=
      &local_d0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT62(local_d0._M_dataplus._M_p._2_6_,(short)local_d0._M_dataplus._M_p));
  }
  return false;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}